

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib547.c
# Opt level: O0

int test(char *URL)

{
  int iVar1;
  undefined4 local_2c;
  long lStack_28;
  int counter;
  CURL *curl;
  char *pcStack_18;
  CURLcode res;
  char *URL_local;
  
  local_2c = 0;
  pcStack_18 = URL;
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    lStack_28 = curl_easy_init();
    if (lStack_28 == 0) {
      curl_mfprintf(_stderr,"curl_easy_init() failed\n");
      curl_global_cleanup();
      URL_local._4_4_ = 0x7e;
    }
    else {
      curl._4_4_ = curl_easy_setopt(lStack_28,0x2712,pcStack_18);
      if (((((curl._4_4_ == 0) && (curl._4_4_ = curl_easy_setopt(lStack_28,0x29,1), curl._4_4_ == 0)
            ) && (curl._4_4_ = curl_easy_setopt(lStack_28,0x2a,1), curl._4_4_ == 0)) &&
          ((((curl._4_4_ = curl_easy_setopt(lStack_28,0x4ea2,ioctlcallback), curl._4_4_ == 0 &&
             (curl._4_4_ = curl_easy_setopt(lStack_28,0x2793,&local_2c), curl._4_4_ == 0)) &&
            ((curl._4_4_ = curl_easy_setopt(lStack_28,0x4e2c,readcallback), curl._4_4_ == 0 &&
             ((curl._4_4_ = curl_easy_setopt(lStack_28,0x2719,&local_2c), curl._4_4_ == 0 &&
              (curl._4_4_ = curl_easy_setopt(lStack_28,0x3c,0x24), curl._4_4_ == 0)))))) &&
           (curl._4_4_ = curl_easy_setopt(lStack_28,0x2f,1), curl._4_4_ == 0)))) &&
         (((curl._4_4_ = curl_easy_setopt(lStack_28,0x2714,libtest_arg2), curl._4_4_ == 0 &&
           (curl._4_4_ = curl_easy_setopt(lStack_28,0x2716,libtest_arg3), curl._4_4_ == 0)) &&
          (curl._4_4_ = curl_easy_setopt(lStack_28,0x6f,0xb), curl._4_4_ == 0)))) {
        curl._4_4_ = curl_easy_perform(lStack_28);
      }
      curl_easy_cleanup(lStack_28);
      curl_global_cleanup();
      URL_local._4_4_ = curl._4_4_;
    }
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    URL_local._4_4_ = 0x7e;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURLcode res;
  CURL *curl;
#ifndef LIB548
  int counter=0;
#endif

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  test_setopt(curl, CURLOPT_URL, URL);
  test_setopt(curl, CURLOPT_VERBOSE, 1L);
  test_setopt(curl, CURLOPT_HEADER, 1L);
#ifdef LIB548
  /* set the data to POST with a mere pointer to a zero-terminated string */
  test_setopt(curl, CURLOPT_POSTFIELDS, UPLOADTHIS);
#else
  /* 547 style, which means reading the POST data from a callback */
  test_setopt(curl, CURLOPT_IOCTLFUNCTION, ioctlcallback);
  test_setopt(curl, CURLOPT_IOCTLDATA, &counter);
  test_setopt(curl, CURLOPT_READFUNCTION, readcallback);
  test_setopt(curl, CURLOPT_READDATA, &counter);
  /* We CANNOT do the POST fine without setting the size (or choose
     chunked)! */
  test_setopt(curl, CURLOPT_POSTFIELDSIZE, (long)strlen(UPLOADTHIS));
#endif
  test_setopt(curl, CURLOPT_POST, 1L);
  test_setopt(curl, CURLOPT_PROXY, libtest_arg2);
  test_setopt(curl, CURLOPT_PROXYUSERPWD, libtest_arg3);
  test_setopt(curl, CURLOPT_PROXYAUTH,
                   (long) (CURLAUTH_NTLM | CURLAUTH_DIGEST | CURLAUTH_BASIC) );

  res = curl_easy_perform(curl);

test_cleanup:

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return (int)res;
}